

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawutil.cpp
# Opt level: O3

void qDrawPlainRect(QPainter *p,int x,int y,int w,int h,QColor *c,int lineWidth,QBrush *fill)

{
  long in_FS_OFFSET;
  undefined1 auStack_80 [4];
  int local_7c;
  double local_78;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  QBrush local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (h != 0 && w != 0) {
    if ((h | w | lineWidth) < 0) {
      qDrawPlainRect();
    }
    else {
      local_7c = x;
      QPainter::save();
      if (lineWidth != 0 || fill != (QBrush *)0x0) {
        local_78 = (double)lineWidth;
        if (0 < lineWidth) {
          QBrush::QBrush(local_40,c,SolidPattern);
          QPen::QPen((QPen *)&local_68,local_40,local_78,SolidLine,SquareCap,MiterJoin);
          QPainter::setPen((QPen *)p);
          QPen::~QPen((QPen *)&local_68);
          QBrush::~QBrush(local_40);
        }
        if (fill == (QBrush *)0x0) {
          QBrush::QBrush((QBrush *)&local_68,NoBrush);
        }
        else {
          QBrush::QBrush((QBrush *)&local_68,fill);
        }
        QPainter::setBrush((QBrush *)p);
        QBrush::~QBrush((QBrush *)&local_68);
        dStack_50 = local_78 * 0.5;
        local_68 = (double)local_7c + dStack_50;
        dStack_60 = (double)y + dStack_50;
        local_58 = ((double)w - dStack_50) - dStack_50;
        dStack_50 = ((double)h - dStack_50) - dStack_50;
        QPainter::drawRects((QRectF *)p,(int)auStack_80 + 0x18);
      }
      QPainter::restore();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qDrawPlainRect(QPainter *p, int x, int y, int w, int h, const QColor &c,
                    int lineWidth, const QBrush *fill)
{
    if (w == 0 || h == 0)
        return;
    if (Q_UNLIKELY(w < 0 || h < 0 || lineWidth < 0)) {
        qWarning("qDrawPlainRect: Invalid parameters");
        return;
    }

    QPainterStateGuard painterGuard(p);
    if (lineWidth == 0 && !fill)
        return;
    if (lineWidth > 0)
        p->setPen(QPen(c, lineWidth, Qt::SolidLine, Qt::SquareCap, Qt::MiterJoin));
    p->setBrush(fill ? *fill : Qt::NoBrush);
    const QRectF r(x, y, w, h);
    const auto lw2 = lineWidth / 2.;
    const QRectF rect = r.marginsRemoved(QMarginsF(lw2, lw2, lw2, lw2));
    p->drawRect(rect);
}